

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O0

FT_Error pfr_face_get_kerning(FT_Face pfrface,FT_UInt glyph1,FT_UInt glyph2,FT_Vector *kerning)

{
  uint uVar1;
  FT_Stream stream_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  FT_Error FVar5;
  int iVar6;
  byte *pbVar7;
  uint local_90;
  uint local_8c;
  FT_Int value;
  FT_UInt32 cpair;
  FT_Byte *p;
  FT_Bool twobyte_adj;
  byte *pbStack_78;
  FT_Bool twobytes;
  FT_Byte *base;
  uint local_68;
  FT_UInt extra;
  FT_UInt probe;
  FT_UInt power;
  FT_UInt size;
  FT_UInt count;
  FT_Stream stream;
  PFR_KernItem_conflict item;
  FT_UInt32 pair;
  FT_UInt32 code2;
  FT_UInt32 code1;
  PFR_PhyFont phy_font;
  FT_Error error;
  PFR_Face face;
  FT_Vector *kerning_local;
  FT_UInt glyph2_local;
  FT_UInt glyph1_local;
  FT_Face pfrface_local;
  
  kerning->x = 0;
  kerning->y = 0;
  kerning_local._4_4_ = glyph1;
  if (glyph1 != 0) {
    kerning_local._4_4_ = glyph1 - 1;
  }
  kerning_local._0_4_ = glyph2;
  if (glyph2 != 0) {
    kerning_local._0_4_ = glyph2 - 1;
  }
  if ((*(uint *)&pfrface[2].generic.data < kerning_local._4_4_) ||
     (*(uint *)&pfrface[2].generic.data < (FT_UInt)kerning_local)) {
    return 0;
  }
  uVar4 = *(int *)(pfrface[2].bbox.xMin + (ulong)kerning_local._4_4_ * 0x10) << 0x10 |
          *(uint *)(pfrface[2].bbox.xMin + (ulong)(FT_UInt)kerning_local * 0x10) & 0xffff;
  stream = (FT_Stream)pfrface[2].bbox.xMax;
  stream_00 = pfrface->stream;
  while( true ) {
    if (stream == (FT_Stream)0x0) {
      return 0;
    }
    if ((*(uint *)&stream->descriptor <= uVar4) &&
       (uVar4 <= *(uint *)((long)&stream->descriptor + 4))) break;
    stream = (FT_Stream)stream->base;
  }
  FVar5 = FT_Stream_Seek(stream_00,stream->pos);
  if (FVar5 != 0) {
    return FVar5;
  }
  FVar5 = FT_Stream_EnterFrame
                    (stream_00,(ulong)((uint)(byte)stream->size * *(int *)((long)&stream->size + 4))
                    );
  if (FVar5 != 0) {
    return FVar5;
  }
  bVar2 = (byte)stream->size;
  uVar1 = *(uint *)((long)&stream->size + 4);
  iVar6 = 0x1f;
  if (bVar2 != 0) {
    for (; bVar2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
  }
  iVar6 = 1 << (0x1f - ((byte)iVar6 ^ 0x1f) & 0x1f);
  local_68 = iVar6 * uVar1;
  iVar6 = (uint)bVar2 - iVar6;
  pbStack_78 = stream_00->cursor;
  bVar2 = *(byte *)((long)&stream->size + 1) & 1;
  bVar3 = *(byte *)((long)&stream->size + 1) & 2;
  if (iVar6 == 0) {
LAB_002fc96d:
    while (uVar1 < local_68) {
      local_68 = local_68 >> 1;
      pbVar7 = pbStack_78 + local_68;
      if (bVar2 == 0) {
        _value = pbVar7 + 2;
        local_8c = (uint)*pbVar7 << 0x10 | (uint)pbVar7[1];
      }
      else {
        _value = pbVar7 + 4;
        local_8c = (uint)*pbVar7 << 0x18 | (uint)pbVar7[1] << 0x10 | (uint)pbVar7[2] << 8 |
                   (uint)pbVar7[3];
      }
      if (local_8c == uVar4) goto LAB_002fcabe;
      if (local_8c < uVar4) {
        pbStack_78 = pbStack_78 + local_68;
      }
    }
    if (bVar2 == 0) {
      _value = pbStack_78 + 2;
      local_8c = (uint)*pbStack_78 << 0x10 | (uint)pbStack_78[1];
    }
    else {
      _value = pbStack_78 + 4;
      local_8c = (uint)*pbStack_78 << 0x18 | (uint)pbStack_78[1] << 0x10 | (uint)pbStack_78[2] << 8
                 | (uint)pbStack_78[3];
    }
    if (local_8c != uVar4) goto LAB_002fcb0f;
  }
  else {
    pbVar7 = pbStack_78 + iVar6 * uVar1;
    if (bVar2 == 0) {
      _value = pbVar7 + 2;
      local_8c = (uint)*pbVar7 << 0x10 | (uint)pbVar7[1];
    }
    else {
      _value = pbVar7 + 4;
      local_8c = (uint)*pbVar7 << 0x18 | (uint)pbVar7[1] << 0x10 | (uint)pbVar7[2] << 8 |
                 (uint)pbVar7[3];
    }
    if (local_8c != uVar4) {
      if (local_8c < uVar4) {
        if (bVar3 == 0) {
          _value = _value + 1;
        }
        else {
          _value = _value + 2;
        }
        pbStack_78 = _value;
      }
      goto LAB_002fc96d;
    }
  }
LAB_002fcabe:
  if (bVar3 == 0) {
    local_90 = (uint)*_value;
  }
  else {
    local_90 = (uint)CONCAT11(*_value,_value[1]);
  }
  kerning->x = (long)(int)((int)*(short *)((long)&stream->size + 2) + local_90);
LAB_002fcb0f:
  FT_Stream_ExitFrame(stream_00);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_get_kerning( FT_Face     pfrface,        /* PFR_Face */
                        FT_UInt     glyph1,
                        FT_UInt     glyph2,
                        FT_Vector*  kerning )
  {
    PFR_Face     face     = (PFR_Face)pfrface;
    FT_Error     error    = FT_Err_Ok;
    PFR_PhyFont  phy_font = &face->phy_font;
    FT_UInt32    code1, code2, pair;


    kerning->x = 0;
    kerning->y = 0;

    if ( glyph1 > 0 )
      glyph1--;

    if ( glyph2 > 0 )
      glyph2--;

    /* convert glyph indices to character codes */
    if ( glyph1 > phy_font->num_chars ||
         glyph2 > phy_font->num_chars )
      goto Exit;

    code1 = phy_font->chars[glyph1].char_code;
    code2 = phy_font->chars[glyph2].char_code;
    pair  = PFR_KERN_INDEX( code1, code2 );

    /* now search the list of kerning items */
    {
      PFR_KernItem  item   = phy_font->kern_items;
      FT_Stream     stream = pfrface->stream;


      for ( ; item; item = item->next )
      {
        if ( pair >= item->pair1 && pair <= item->pair2 )
          goto FoundPair;
      }
      goto Exit;

    FoundPair: /* we found an item, now parse it and find the value if any */
      if ( FT_STREAM_SEEK( item->offset )                       ||
           FT_FRAME_ENTER( item->pair_count * item->pair_size ) )
        goto Exit;

      {
        FT_UInt    count       = item->pair_count;
        FT_UInt    size        = item->pair_size;
        FT_UInt    power       = 1 << FT_MSB( count );
        FT_UInt    probe       = power * size;
        FT_UInt    extra       = count - power;
        FT_Byte*   base        = stream->cursor;
        FT_Bool    twobytes    = FT_BOOL( item->flags & PFR_KERN_2BYTE_CHAR );
        FT_Bool    twobyte_adj = FT_BOOL( item->flags & PFR_KERN_2BYTE_ADJ  );
        FT_Byte*   p;
        FT_UInt32  cpair;


        if ( extra > 0 )
        {
          p = base + extra * size;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
          {
            if ( twobyte_adj )
              p += 2;
            else
              p++;
            base = p;
          }
        }

        while ( probe > size )
        {
          probe >>= 1;
          p       = base + probe;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
            base += probe;
        }

        p = base;

        if ( twobytes )
          cpair = FT_NEXT_ULONG( p );
        else
          cpair = PFR_NEXT_KPAIR( p );

        if ( cpair == pair )
        {
          FT_Int  value;


        Found:
          if ( twobyte_adj )
            value = FT_PEEK_SHORT( p );
          else
            value = p[0];

          kerning->x = item->base_adj + value;
        }
      }

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }